

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int minTemp0_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  bVar2 = (byte)(iVar + -6);
  iVar1 = -4 << (bVar2 & 0x1f);
  if (nWords < 1) {
    iVar3 = 0;
    iVar1 = 0;
  }
  else {
    uVar5 = 1 << (bVar2 & 0x1f);
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 2) {
      uVar6 = 1;
    }
    uVar5 = nWords - 1;
    iVar3 = nWords + (-3 << (bVar2 & 0x1f)) + -1;
    do {
      if (iVar + -6 != 0x1f) {
        lVar7 = 0;
        do {
          iVar4 = -(uint)(pInOut[(ulong)uVar5 + lVar7] < pInOut[iVar3 + (int)lVar7]);
          if (pInOut[iVar3 + (int)lVar7] < pInOut[(ulong)uVar5 + lVar7]) {
            iVar4 = 1;
          }
          if (iVar4 != 0) {
            iVar3 = uVar5 + 1;
            if (iVar4 == -1) goto LAB_00569bc5;
            iVar1 = 3;
            goto LAB_00569bdc;
          }
          lVar7 = lVar7 + -1;
        } while (-lVar7 != uVar6);
      }
      iVar3 = iVar3 + iVar1;
      uVar5 = uVar5 + iVar1;
    } while (-1 < (int)uVar5);
    iVar3 = 0;
LAB_00569bc5:
    iVar1 = 0;
  }
LAB_00569bdc:
  *pDifStart = iVar3;
  return iVar1;
}

Assistant:

int minTemp0_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int wordDif = 3*wordBlock;
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp0_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordDif]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 3;
            }
        }
    *pDifStart=0;
//    printf("out minTemp0_fast_moreThen5\n");

    return 0;
}